

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_zero_initialized_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t type_id)

{
  ParsedIR *this_00;
  uint32_t id;
  SPIRType *pSVar1;
  SPIRConstant *c;
  
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      type_id);
  if (pSVar1->storage - StorageClassPrivate < 3) {
    this_00 = &(this->super_Compiler).ir;
    id = ParsedIR::increase_bound_by(this_00,1);
    ParsedIR::make_constant_null(this_00,id,type_id,false);
    c = Variant::get<spirv_cross::SPIRConstant>
                  ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr + id);
    constant_expression_abi_cxx11_(__return_storage_ptr__,this,c,false);
    return __return_storage_ptr__;
  }
  __assert_fail("type.storage == StorageClassPrivate || type.storage == StorageClassFunction || type.storage == StorageClassGeneric"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0x36f7,
                "virtual string spirv_cross::CompilerGLSL::to_zero_initialized_expression(uint32_t)"
               );
}

Assistant:

string CompilerGLSL::to_zero_initialized_expression(uint32_t type_id)
{
#ifndef NDEBUG
	auto &type = get<SPIRType>(type_id);
	assert(type.storage == StorageClassPrivate || type.storage == StorageClassFunction ||
	       type.storage == StorageClassGeneric);
#endif
	uint32_t id = ir.increase_bound_by(1);
	ir.make_constant_null(id, type_id, false);
	return constant_expression(get<SPIRConstant>(id));
}